

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O3

apx_error_t
apx_dataElement_derive_types_on_element
          (apx_dataElement_t *self,adt_ary_t *type_list,adt_hash_t *type_map)

{
  apx_typeCode_t aVar1;
  apx_typeId_t s32Index;
  int32_t iVar2;
  apx_error_t aVar3;
  void **ppvVar4;
  apx_dataType_t *self_00;
  int s32Index_00;
  
  if (type_map == (adt_hash_t *)0x0 ||
      (type_list == (adt_ary_t *)0x0 || self == (apx_dataElement_t *)0x0)) {
    return 1;
  }
  aVar1 = self->type_code;
  if (aVar1 == '\x11') {
    self_00 = (apx_dataType_t *)adt_hash_value(type_map,(self->type_ref).name);
    if (self_00 == (apx_dataType_t *)0x0) {
      return 0x10;
    }
  }
  else {
    if (aVar1 != '\x10') {
      if (aVar1 != '\x0f') {
        return 0;
      }
      if (self->elements == (adt_ary_t *)0x0) {
        return 0;
      }
      iVar2 = adt_ary_length(self->elements);
      if (iVar2 < 1) {
        return 0;
      }
      s32Index_00 = 0;
      while( true ) {
        if (self->elements == (adt_ary_t *)0x0) {
          return 0x24;
        }
        ppvVar4 = adt_ary_get(self->elements,s32Index_00);
        if (ppvVar4 == (void **)0x0) {
          return 0x24;
        }
        if ((apx_dataElement_t *)*ppvVar4 == (apx_dataElement_t *)0x0) {
          return 0x24;
        }
        aVar3 = apx_dataElement_derive_types_on_element
                          ((apx_dataElement_t *)*ppvVar4,type_list,type_map);
        if (aVar3 != 0) break;
        s32Index_00 = s32Index_00 + 1;
        if (iVar2 == s32Index_00) {
          return 0;
        }
      }
      return aVar3;
    }
    s32Index = (self->type_ref).id;
    if ((int)s32Index < 0) {
      return 0x10;
    }
    iVar2 = adt_ary_length(type_list);
    if (iVar2 < (int)s32Index) {
      return 0x10;
    }
    self_00 = (apx_dataType_t *)adt_ary_value(type_list,s32Index);
    if (self_00 == (apx_dataType_t *)0x0) {
      return 0x24;
    }
  }
  aVar3 = apx_dataType_derive_types_on_element(self_00,type_list,type_map);
  if (aVar3 == 0) {
    apx_dataElement_set_type_ref_ptr(self,self_00);
    aVar3 = 0;
  }
  return aVar3;
}

Assistant:

apx_error_t apx_dataElement_derive_types_on_element(apx_dataElement_t* self, adt_ary_t const* type_list, adt_hash_t const* type_map)
{
   if ( (self != NULL) && (type_list != NULL) && (type_map != NULL) )
   {
      apx_typeCode_t const type_code = self->type_code;
      if (type_code == APX_TYPE_CODE_RECORD)
      {
         apx_error_t result = APX_NO_ERROR;
         int32_t i;
         int32_t num_elements = apx_dataElement_get_num_child_elements(self);
         for (i = 0; i < num_elements; i++)
         {
            apx_dataElement_t* child_element = apx_dataElement_get_child_at(self, i);            
            if (child_element == NULL)
            {
               return APX_NULL_PTR_ERROR;
            }
            result = apx_dataElement_derive_types_on_element(child_element, type_list, type_map);            
            if (result != APX_NO_ERROR)
            {
               return result;
            }
         }
      }
      else if (type_code == APX_TYPE_CODE_REF_ID)
      {
         apx_dataType_t* data_type = NULL;
         apx_error_t result = APX_NO_ERROR;
         int32_t type_index = (int32_t) apx_dataElement_get_type_ref_id(self);         
         if ((type_index < 0) || (type_index > adt_ary_length(type_list)))
         {
            return APX_INVALID_TYPE_REF_ERROR;
         }
         data_type = adt_ary_value(type_list, type_index);
         if (data_type == NULL)
         {
            return APX_NULL_PTR_ERROR;
         }
         result = apx_dataType_derive_types_on_element(data_type, type_list, type_map);
         if (result != APX_NO_ERROR)
         {
            return result;
         }
         apx_dataElement_set_type_ref_ptr(self, (void*) data_type);
      }
      else if (type_code == APX_TYPE_CODE_REF_NAME)
      {
         apx_dataType_t* data_type = NULL;         
         char const* type_name = apx_dataElement_get_type_ref_name(self);
         data_type = (apx_dataType_t*)adt_hash_value(type_map, type_name);         
         if (data_type != NULL)
         {            
            apx_error_t result = apx_dataType_derive_types_on_element(data_type, type_list, type_map);            
            if (result != APX_NO_ERROR)
            {
               return result;
            }
            apx_dataElement_set_type_ref_ptr(self, (void*)data_type);
         }
         else
         {
            return APX_INVALID_TYPE_REF_ERROR;
         }
      }
      else
      {
         //Type already derived
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}